

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

_anonymous_namespace_ * __thiscall
(anonymous_namespace)::percent_str_abi_cxx11_(_anonymous_namespace_ *this,index_t num,index_t denom)

{
  String local_b0 [48];
  String local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [32];
  double local_20;
  double x;
  index_t denom_local;
  index_t num_local;
  
  x._0_4_ = denom;
  x._4_4_ = num;
  _denom_local = this;
  if (denom == 0) {
    GEO::String::to_string<unsigned_int>((String *)this,(uint *)((long)&x + 4));
  }
  else {
    local_20 = ((double)num / (double)denom) * 100.0;
    GEO::String::to_string<unsigned_int>(local_80,(uint *)((long)&x + 4));
    std::operator+(local_60,(char *)local_80);
    GEO::String::to_string<double>(local_b0,&local_20);
    std::operator+(local_40,local_60);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   (char *)local_40);
    std::__cxx11::string::~string((string *)local_40);
    std::__cxx11::string::~string((string *)local_b0);
    std::__cxx11::string::~string((string *)local_60);
    std::__cxx11::string::~string((string *)local_80);
  }
  return this;
}

Assistant:

std::string percent_str(index_t num, index_t denom) {
        if(denom == 0) {
            return String::to_string(num);
        }
        double x = double(num) / double(denom) * 100.0;
        return String::to_string(num) + "(" + String::to_string(x) + "%)";
    }